

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O0

Result_Type
chaiscript::detail::Cast_Helper_Inner<bool_&>::cast(Boxed_Value *ob,Type_Conversions_State *param_2)

{
  bool bVar1;
  Type_Info *this;
  Result_Type pbVar2;
  undefined8 uVar3;
  type_info *in_RDI;
  bad_any_cast *unaff_retaddr;
  
  this = Boxed_Value::get_type_info((Boxed_Value *)0x389c08);
  bVar1 = Type_Info::is_const(this);
  if (!bVar1) {
    Boxed_Value::get_type_info((Boxed_Value *)0x389c1e);
    bVar1 = Type_Info::bare_equal_type_info((Type_Info *)unaff_retaddr,in_RDI);
    if (bVar1) {
      Boxed_Value::get_ptr((Boxed_Value *)0x389c3d);
      pbVar2 = (Result_Type)throw_if_null<void>(unaff_retaddr);
      return pbVar2;
    }
  }
  uVar3 = __cxa_allocate_exception(0x28);
  exception::bad_any_cast::bad_any_cast(unaff_retaddr);
  __cxa_throw(uVar3,&exception::bad_any_cast::typeinfo,exception::bad_any_cast::~bad_any_cast);
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (!ob.get_type_info().is_const() && ob.get_type_info().bare_equal_type_info(typeid(Result)))
          {
            return *(static_cast<Result *>(throw_if_null(ob.get_ptr())));
          } else {
            throw chaiscript::detail::exception::bad_any_cast();
          }
        }